

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2channel_unthrottle(SshChannel *sc,size_t bufsize)

{
  ssh2_connection_state *psVar1;
  int local_34;
  size_t buflimit;
  ssh2_connection_state *s;
  ssh2_channel *c;
  size_t bufsize_local;
  SshChannel *sc_local;
  
  psVar1 = ((ssh2_channel *)(sc + -0xb))->connlayer;
  if ((psVar1->ssh_is_simple & 1U) == 0) {
    local_34 = *(int *)((long)&sc[-4].cl + 4);
  }
  else {
    local_34 = 0;
  }
  if (bufsize < (ulong)(long)local_34) {
    ssh2_set_window((ssh2_channel *)(sc + -0xb),local_34 - (int)bufsize);
  }
  if ((((ulong)sc[-10].cl & 0x10000000000) != 0) && (bufsize <= (ulong)(long)local_34)) {
    *(undefined1 *)((long)&sc[-10].cl + 5) = 0;
    ssh_throttle_conn((psVar1->ppl).ssh,-1);
  }
  return;
}

Assistant:

static void ssh2channel_unthrottle(SshChannel *sc, size_t bufsize)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;
    size_t buflimit;

    buflimit = s->ssh_is_simple ? 0 : c->locmaxwin;
    if (bufsize < buflimit)
        ssh2_set_window(c, buflimit - bufsize);

    if (c->throttling_conn && bufsize <= buflimit) {
        c->throttling_conn = false;
        ssh_throttle_conn(s->ppl.ssh, -1);
    }
}